

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall
QFileDialogPrivate::fileRenamed
          (QFileDialogPrivate *this,QString *path,QString *oldName,QString *newName)

{
  long lVar1;
  bool bVar2;
  FileMode FVar3;
  QLineEdit *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  FileMode fileMode;
  QString *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  FVar3 = QFileDialog::fileMode
                    ((QFileDialog *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (FVar3 == Directory) {
    rootPath((QFileDialogPrivate *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78);
    bVar4 = 0;
    if (bVar2) {
      lineEdit((QFileDialogPrivate *)0x75d54c);
      QLineEdit::text(in_RSI);
      bVar4 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78);
      QString::~QString((QString *)0x75d58c);
    }
    QString::~QString((QString *)0x75d596);
    if ((bVar4 & 1) != 0) {
      lineEdit((QFileDialogPrivate *)0x75d5aa);
      QLineEdit::setText((QLineEdit *)CONCAT17(bVar4,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::fileRenamed(const QString &path, const QString &oldName, const QString &newName)
{
    const QFileDialog::FileMode fileMode = q_func()->fileMode();
    if (fileMode == QFileDialog::Directory) {
        if (path == rootPath() && lineEdit()->text() == oldName)
            lineEdit()->setText(newName);
    }
}